

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O0

SAttribute * __thiscall
irr::io::CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase>::getAttributeByName
          (CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase> *this,unsigned_short *name)

{
  bool bVar1;
  u32 uVar2;
  SAttribute *this_00;
  u32 local_34;
  undefined1 local_30 [4];
  int i;
  string<unsigned_short> n;
  unsigned_short *name_local;
  CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase> *this_local;
  
  if (name == (unsigned_short *)0x0) {
    this_local = (CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase> *)0x0;
  }
  else {
    n._8_8_ = name;
    core::string<unsigned_short>::string<unsigned_short>((string<unsigned_short> *)local_30,name);
    local_34 = 0;
    while( true ) {
      uVar2 = core::array<irr::io::CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase>::SAttribute>::
              size(&this->Attributes);
      if ((int)uVar2 <= (int)local_34) break;
      this_00 = core::array<irr::io::CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase>::SAttribute>
                ::operator[](&this->Attributes,local_34);
      bVar1 = core::string<unsigned_short>::operator==
                        (&this_00->Name,(string<unsigned_short> *)local_30);
      if (bVar1) {
        this_local = (CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase> *)
                     core::
                     array<irr::io::CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase>::SAttribute>::
                     operator[](&this->Attributes,local_34);
        goto LAB_00bef569;
      }
      local_34 = local_34 + 1;
    }
    this_local = (CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase> *)0x0;
LAB_00bef569:
    core::string<unsigned_short>::~string((string<unsigned_short> *)local_30);
  }
  return (SAttribute *)this_local;
}

Assistant:

const SAttribute* getAttributeByName(const char_type* name) const
	{
		if (!name)
			return 0;

		core::string<char_type> n = name;

		for (int i=0; i<(int)Attributes.size(); ++i)
			if (Attributes[i].Name == n)
				return &Attributes[i];

		return 0;
	}